

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::Cluster::Parse(Cluster *this,longlong *pos,long *len)

{
  int iVar1;
  longlong lVar2;
  long lVar3;
  longlong lVar4;
  ulong block_size;
  long *plVar5;
  long lVar6;
  long lStack_50;
  longlong avail;
  IMkvReader *local_40;
  longlong total;
  undefined4 extraout_var;
  
  lStack_50 = Load(this,pos,len);
  if (-1 < lStack_50) {
    lStack_50 = -1;
    if ((this->m_element_start <= this->m_pos) && (-1 < this->m_timecode)) {
      lVar6 = this->m_element_start + this->m_element_size;
      if (this->m_element_size < 0) {
        lVar6 = -1;
      }
      if (this->m_pos < lVar6 || lVar6 < 0) {
        local_40 = this->m_pSegment->m_pReader;
        iVar1 = (*local_40->_vptr_IMkvReader[1])(local_40,&total,&avail);
        if (iVar1 < 0) {
          return (long)iVar1;
        }
        if ((-1 < total) && (total < avail)) {
          return -2;
        }
        lVar2 = this->m_pos;
        *pos = lVar2;
        while( true ) {
          if ((-1 < lVar6) && (lVar6 <= lVar2)) goto LAB_0010ccb8;
          if ((-1 < total) && (total <= lVar2)) break;
          if (avail <= lVar2) {
LAB_0010cc97:
            *len = 1;
            return -3;
          }
          lVar2 = GetUIntLength(local_40,lVar2,len);
          if (lVar2 < 0) {
            return lVar2;
          }
          if (lVar2 != 0) {
            return -3;
          }
          lVar3 = *len + *pos;
          if (-1 < lVar6 && lVar6 < lVar3) {
            return -2;
          }
          if (avail < lVar3) {
            return -3;
          }
          lVar4 = ReadID(local_40,*pos,len);
          if (lVar4 < 0) {
            return -2;
          }
          if ((lVar4 == 0x1f43b675) || (lVar4 == 0x1c53bb6b)) {
            if (this->m_element_size < 0) {
              this->m_element_size = *pos - this->m_element_start;
            }
            goto LAB_0010ccb8;
          }
          lVar3 = *pos + *len;
          *pos = lVar3;
          if (avail <= lVar3) goto LAB_0010cc97;
          lVar2 = GetUIntLength(local_40,lVar3,len);
          if (lVar2 < 0) {
            return lVar2;
          }
          if (lVar2 != 0) {
            return -3;
          }
          lVar3 = *len + *pos;
          if (-1 < lVar6 && lVar6 < lVar3) {
            return -2;
          }
          if (avail < lVar3) {
            return -3;
          }
          block_size = ReadUInt(local_40,*pos,len);
          if ((long)block_size < 0) {
            return block_size;
          }
          if ((-1L << ((char)*len * '\a' & 0x3fU) ^ block_size) == 0xffffffffffffffff) {
            return -2;
          }
          lVar2 = *len + *pos;
          *pos = lVar2;
          if (-1 < lVar6 && lVar6 < lVar2) {
            return -2;
          }
          if (block_size != 0) {
            lVar2 = lVar2 + block_size;
            if (lVar6 < 0) {
              if ((-1 < total) && (total < lVar2)) {
                this->m_element_size = total - this->m_element_start;
                *pos = total;
                goto LAB_0010ccb8;
              }
              if (avail < lVar2) {
                *len = block_size;
                return -3;
              }
            }
            else if (lVar6 < lVar2) {
              if (lVar4 == 0xa0) {
                return -2;
              }
              if (lVar4 == 0xa3) {
                return -2;
              }
              *pos = lVar6;
LAB_0010ccb8:
              lVar3 = this->m_element_size;
              goto LAB_0010ccc0;
            }
            if (lVar4 == 0xa3) {
              lVar6 = ParseSimpleBlock(this,block_size,pos,len);
              return lVar6;
            }
            if (lVar4 == 0xa0) {
              lVar6 = ParseBlockGroup(this,block_size,pos,len);
              return lVar6;
            }
            *pos = lVar2;
            if ((-1 < lVar6) && (lVar6 < lVar2)) {
              return -2;
            }
          }
        }
        lVar3 = this->m_element_size;
        if (lVar3 < 0) {
          lVar3 = lVar2 - this->m_element_start;
          this->m_element_size = lVar3;
        }
LAB_0010ccc0:
        if (lVar3 < 1) {
          return -2;
        }
        lVar3 = *pos;
        this->m_pos = lVar3;
        if (-1 < lVar6 && lVar6 < lVar3) {
          return -2;
        }
        if (0 < this->m_entries_count) {
          if (this->m_entries[this->m_entries_count + -1] == (BlockEntry *)0x0) {
            return -1;
          }
          iVar1 = (*this->m_entries[this->m_entries_count + -1]->_vptr_BlockEntry[2])();
          plVar5 = (long *)CONCAT44(extraout_var,iVar1);
          if (plVar5 == (long *)0x0) {
            return -1;
          }
          if ((-1 < total) && (total < *plVar5)) {
            return -1;
          }
          lVar3 = *plVar5 + plVar5[1];
          if ((-1 < lVar6) && (lVar6 < lVar3)) {
            return -2;
          }
          if ((-1 < total) && (total < lVar3)) {
            return -1;
          }
        }
      }
      lStack_50 = 1;
    }
  }
  return lStack_50;
}

Assistant:

long Cluster::Parse(long long& pos, long& len) const {
  long status = Load(pos, len);

  if (status < 0)
    return status;

  if (m_pos < m_element_start || m_timecode < 0)
    return E_PARSE_FAILED;

  const long long cluster_stop =
      (m_element_size < 0) ? -1 : m_element_start + m_element_size;

  if ((cluster_stop >= 0) && (m_pos >= cluster_stop))
    return 1;  // nothing else to do

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long total, avail;

  status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  if (total >= 0 && avail > total)
    return E_FILE_FORMAT_INVALID;

  pos = m_pos;

  for (;;) {
    if ((cluster_stop >= 0) && (pos >= cluster_stop))
      break;

    if ((total >= 0) && (pos >= total)) {
      if (m_element_size < 0)
        m_element_size = pos - m_element_start;

      break;
    }

    // Parse ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    // This is the distinguished set of ID's we use to determine
    // that we have exhausted the sub-element's inside the cluster
    // whose ID we parsed earlier.

    if ((id == libwebm::kMkvCluster) || (id == libwebm::kMkvCues)) {
      if (m_element_size < 0)
        m_element_size = pos - m_element_start;

      break;
    }

    pos += len;  // consume ID field

    // Parse Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume size field

    if ((cluster_stop >= 0) && (pos > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    // pos now points to start of payload

    if (size == 0)
      continue;

    // const long long block_start = pos;
    const long long block_stop = pos + size;

    if (cluster_stop >= 0) {
      if (block_stop > cluster_stop) {
        if (id == libwebm::kMkvBlockGroup || id == libwebm::kMkvSimpleBlock) {
          return E_FILE_FORMAT_INVALID;
        }

        pos = cluster_stop;
        break;
      }
    } else if ((total >= 0) && (block_stop > total)) {
      m_element_size = total - m_element_start;
      pos = total;
      break;
    } else if (block_stop > avail) {
      len = static_cast<long>(size);
      return E_BUFFER_NOT_FULL;
    }

    Cluster* const this_ = const_cast<Cluster*>(this);

    if (id == libwebm::kMkvBlockGroup)
      return this_->ParseBlockGroup(size, pos, len);

    if (id == libwebm::kMkvSimpleBlock)
      return this_->ParseSimpleBlock(size, pos, len);

    pos += size;  // consume payload
    if (cluster_stop >= 0 && pos > cluster_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (m_element_size < 1)
    return E_FILE_FORMAT_INVALID;

  m_pos = pos;
  if (cluster_stop >= 0 && m_pos > cluster_stop)
    return E_FILE_FORMAT_INVALID;

  if (m_entries_count > 0) {
    const long idx = m_entries_count - 1;

    const BlockEntry* const pLast = m_entries[idx];
    if (pLast == NULL)
      return E_PARSE_FAILED;

    const Block* const pBlock = pLast->GetBlock();
    if (pBlock == NULL)
      return E_PARSE_FAILED;

    const long long start = pBlock->m_start;

    if ((total >= 0) && (start > total))
      return E_PARSE_FAILED;  // defend against trucated stream

    const long long size = pBlock->m_size;

    const long long stop = start + size;
    if (cluster_stop >= 0 && stop > cluster_stop)
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && (stop > total))
      return E_PARSE_FAILED;  // defend against trucated stream
  }

  return 1;  // no more entries
}